

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void __thiscall Overlay_Window::resize(Overlay_Window *this,int X,int Y,int W,int H)

{
  Fl_Widget *pFVar1;
  
  pFVar1 = (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
           resizable_;
  (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.resizable_ =
       (Fl_Widget *)0x0;
  if (((this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
       super_Fl_Widget.w_ != W) ||
     ((this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.h_ != H)) {
    set_modflag(1);
  }
  Fl_Overlay_Window::resize(&this->super_Fl_Overlay_Window,X,Y,W,H);
  (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.resizable_ =
       pFVar1;
  update_xywh();
  return;
}

Assistant:

void Overlay_Window::resize(int X,int Y,int W,int H) {
  Fl_Widget* t = resizable(); resizable(0);

  // do not set the mod flag if the window was not resized. In FLUID, all
  // windows are opened without a given x/y position, so modifying x/y
  // should not mark the project as dirty
  if (W!=w() || H!=h())
    set_modflag(1);

  Fl_Overlay_Window::resize(X,Y,W,H);
  resizable(t);
  update_xywh();
}